

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  double *pdVar2;
  float fVar3;
  double dVar4;
  short sVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  byte bVar10;
  ImVec2 IVar11;
  char cVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  ImGuiWindow *pIVar16;
  ImGuiWindow *pIVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar8 = GImGui;
  pIVar17 = GImGui->MovingWindow;
  pIVar16 = (ImGuiWindow *)0x0;
  if ((pIVar17 != (ImGuiWindow *)0x0) && ((pIVar17->Flags & 0x200) == 0)) {
    pIVar16 = pIVar17;
  }
  pIVar1 = &(GImGui->Style).TouchExtraPadding;
  IVar11 = *pIVar1;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    fVar20 = (GImGui->Style).TouchExtraPadding.x;
    fVar19 = (GImGui->Style).TouchExtraPadding.y;
    if (fVar20 <= 4.0) {
      fVar20 = 4.0;
    }
    if (fVar19 <= 4.0) {
      fVar19 = 4.0;
    }
    IVar11.y = fVar19;
    IVar11.x = fVar20;
  }
  lVar13 = (long)(GImGui->Windows).Size;
  if (lVar13 < 1) {
    pIVar9 = (ImGuiWindow *)0x0;
  }
  else {
    lVar13 = lVar13 + 1;
    pIVar9 = (ImGuiWindow *)0x0;
    do {
      pIVar7 = (GImGui->Windows).Data[lVar13 + -2];
      bVar18 = false;
      if (((pIVar7->Active == true) && (pIVar7->Hidden == false)) &&
         (uVar6 = pIVar7->Flags, (uVar6 >> 9 & 1) == 0)) {
        fVar20 = pIVar1->x;
        if ((uVar6 & 0x1000042) == 0) {
          fVar20 = IVar11.x;
        }
        fVar19 = (GImGui->IO).MousePos.x;
        if ((pIVar7->OuterRectClipped).Min.x - fVar20 <= fVar19) {
          fVar21 = (GImGui->Style).TouchExtraPadding.y;
          if ((uVar6 & 0x1000042) == 0) {
            fVar21 = IVar11.y;
          }
          fVar3 = (GImGui->IO).MousePos.y;
          if ((((pIVar7->OuterRectClipped).Min.y - fVar21 <= fVar3) &&
              (fVar19 < fVar20 + (pIVar7->OuterRectClipped).Max.x)) &&
             (fVar3 < fVar21 + (pIVar7->OuterRectClipped).Max.y)) {
            sVar5 = (pIVar7->HitTestHoleSize).x;
            if (sVar5 != 0) {
              fVar20 = (float)(int)(pIVar7->HitTestHoleOffset).x + (pIVar7->Pos).x;
              if (fVar20 <= fVar19) {
                fVar21 = (float)(int)(pIVar7->HitTestHoleOffset).y + (pIVar7->Pos).y;
                bVar18 = (fVar3 < (float)(int)(pIVar7->HitTestHoleSize).y + fVar21 &&
                         fVar19 < fVar20 + (float)(int)sVar5) && fVar21 <= fVar3;
              }
              else {
                bVar18 = false;
              }
              if (bVar18) {
                bVar18 = false;
                goto LAB_0011be57;
              }
            }
            if (pIVar16 == (ImGuiWindow *)0x0) {
              pIVar16 = pIVar7;
            }
            if (((pIVar9 == (ImGuiWindow *)0x0) && (pIVar9 = pIVar7, pIVar17 != (ImGuiWindow *)0x0))
               && (pIVar7->RootWindow == pIVar17->RootWindow)) {
              pIVar9 = (ImGuiWindow *)0x0;
            }
            bVar18 = pIVar9 != (ImGuiWindow *)0x0 && pIVar16 != (ImGuiWindow *)0x0;
          }
        }
      }
LAB_0011be57:
    } while ((!bVar18) && (lVar13 = lVar13 + -1, 1 < lVar13));
  }
  GImGui->HoveredWindow = pIVar16;
  if (pIVar16 == (ImGuiWindow *)0x0) {
    pIVar17 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar17 = pIVar16->RootWindow;
  }
  pIVar8->HoveredRootWindow = pIVar17;
  pIVar8->HoveredWindowUnderMovingWindow = pIVar9;
  pIVar9 = GetTopMostPopupModal();
  bVar18 = false;
  if ((pIVar9 != (ImGuiWindow *)0x0) && (bVar18 = false, pIVar17 != (ImGuiWindow *)0x0)) {
    if (pIVar17->RootWindow == pIVar9) {
      bVar18 = false;
    }
    else {
      do {
        bVar18 = pIVar17 == pIVar9;
        if (bVar18) goto LAB_0011bec5;
        pIVar17 = pIVar17->ParentWindow;
      } while (pIVar17 != (ImGuiWindow *)0x0);
      bVar18 = false;
LAB_0011bec5:
      bVar18 = (bool)(bVar18 ^ 1);
    }
  }
  uVar6 = (pIVar8->IO).ConfigFlags;
  iVar14 = -1;
  lVar13 = 0;
  bVar10 = 0;
  do {
    if ((pIVar8->IO).MouseClicked[lVar13] == true) {
      bVar15 = true;
      if (pIVar16 == (ImGuiWindow *)0x0) {
        bVar15 = 0 < (pIVar8->OpenPopupStack).Size;
      }
      (pIVar8->IO).MouseDownOwned[lVar13] = bVar15;
    }
    bVar15 = (pIVar8->IO).MouseDown[lVar13];
    if ((bVar15 == true) &&
       ((iVar14 == -1 ||
        (dVar4 = (pIVar8->IO).MouseClickedTime[iVar14],
        pdVar2 = (pIVar8->IO).MouseClickedTime + lVar13, *pdVar2 <= dVar4 && dVar4 != *pdVar2)))) {
      iVar14 = (int)lVar13;
    }
    bVar10 = bVar10 & 1 | bVar15;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 5);
  bVar15 = true;
  if ((uVar6 & 0x10) == 0) {
    bVar15 = bVar18;
  }
  cVar12 = '\x01';
  if (iVar14 != -1) {
    cVar12 = (pIVar8->IO).MouseDownOwned[iVar14];
  }
  bVar18 = true;
  if ((pIVar8->DragDropActive == true) && (bVar18 = true, (pIVar8->DragDropSourceFlags & 0x10) != 0)
     ) {
    bVar18 = bVar15;
  }
  if (cVar12 != '\0') {
    bVar18 = bVar15;
  }
  if (bVar18) {
    pIVar8->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar8->WantCaptureMouseNextFrame == -1) {
    if ((cVar12 == '\0') ||
       ((bVar18 = true, pIVar8->HoveredWindow == (ImGuiWindow *)0x0 && (bVar10 == 0)))) {
      bVar18 = 0 < (pIVar8->OpenPopupStack).Size;
    }
    (pIVar8->IO).WantCaptureMouse = bVar18;
  }
  else {
    (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
    bVar18 = pIVar8->ActiveId != 0 || pIVar9 != (ImGuiWindow *)0x0;
  }
  else {
    bVar18 = pIVar8->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar8->IO).WantCaptureKeyboard = bVar18;
  if (((uVar6 & 9) == 1 & (pIVar8->IO).NavActive) == 1) {
    (pIVar8->IO).WantCaptureKeyboard = true;
  }
  (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}